

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::m_formatter<spdlog::details::scoped_padder>::format
          (m_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  scoped_padder p;
  scoped_padder local_80;
  ulong local_58 [3];
  buffer<char> local_40;
  memory_buf_t *local_20;
  
  scoped_padder::scoped_padder(&local_80,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar3 = tm_time->tm_mon + 1;
  if (uVar3 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    bVar1 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar3 + bVar1 * -10 | 0x30;
  }
  else {
    local_58[0] = (ulong)uVar3;
    local_40.size_ = (dest->super_buffer<char>).size_;
    local_40._vptr_buffer = (_func_int **)&PTR_grow_00148520;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_40.capacity_ = local_40.size_;
    local_20 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_40,fmt,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_80);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
    }